

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::WindowDataParameter::MergeFrom(WindowDataParameter *this,WindowDataParameter *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value;
  InternalMetadataWithArena *this_00;
  LogFinisher local_d5;
  uint32 cached_has_bits;
  byte local_c1;
  LogMessage local_c0;
  WindowDataParameter *local_88;
  WindowDataParameter *from_local;
  WindowDataParameter *this_local;
  InternalMetadataWithArena *local_70;
  InternalMetadataWithArena *local_68;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_c1 = 0;
  local_88 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x99fd);
    local_c1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_c0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_d5,other);
  }
  if ((local_c1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (WindowDataParameter *)&local_88->_internal_metadata_;
  local_70 = this_00;
  local_68 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,&local_28->unknown_fields);
  }
  local_38 = &local_88->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_source(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->source_,psVar2,(local_88->source_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_mean_file(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->mean_file_,psVar2,(local_88->mean_file_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_crop_mode(this);
      default_value =
           google::protobuf::internal::
           ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)_default_crop_mode__abi_cxx11_);
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->crop_mode_,default_value,(local_88->crop_mode_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      set_has_root_folder(this);
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      google::protobuf::internal::ArenaStringPtr::AssignWithDefault
                (&this->root_folder_,psVar2,(local_88->root_folder_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      this->batch_size_ = local_88->batch_size_;
    }
    if ((uVar1 & 0x20) != 0) {
      this->crop_size_ = local_88->crop_size_;
    }
    if ((uVar1 & 0x40) != 0) {
      this->mirror_ = (bool)(local_88->mirror_ & 1);
    }
    if ((uVar1 & 0x80) != 0) {
      this->cache_images_ = (bool)(local_88->cache_images_ & 1);
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0x1f00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this->context_pad_ = local_88->context_pad_;
    }
    if ((uVar1 & 0x200) != 0) {
      this->scale_ = local_88->scale_;
    }
    if ((uVar1 & 0x400) != 0) {
      this->fg_threshold_ = local_88->fg_threshold_;
    }
    if ((uVar1 & 0x800) != 0) {
      this->bg_threshold_ = local_88->bg_threshold_;
    }
    if ((uVar1 & 0x1000) != 0) {
      this->fg_fraction_ = local_88->fg_fraction_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void WindowDataParameter::MergeFrom(const WindowDataParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.WindowDataParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_source();
      source_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.source_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_mean_file();
      mean_file_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.mean_file_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_crop_mode();
      crop_mode_.AssignWithDefault(&WindowDataParameter::_default_crop_mode_.get(), from.crop_mode_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_root_folder();
      root_folder_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.root_folder_);
    }
    if (cached_has_bits & 0x00000010u) {
      batch_size_ = from.batch_size_;
    }
    if (cached_has_bits & 0x00000020u) {
      crop_size_ = from.crop_size_;
    }
    if (cached_has_bits & 0x00000040u) {
      mirror_ = from.mirror_;
    }
    if (cached_has_bits & 0x00000080u) {
      cache_images_ = from.cache_images_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 7936u) {
    if (cached_has_bits & 0x00000100u) {
      context_pad_ = from.context_pad_;
    }
    if (cached_has_bits & 0x00000200u) {
      scale_ = from.scale_;
    }
    if (cached_has_bits & 0x00000400u) {
      fg_threshold_ = from.fg_threshold_;
    }
    if (cached_has_bits & 0x00000800u) {
      bg_threshold_ = from.bg_threshold_;
    }
    if (cached_has_bits & 0x00001000u) {
      fg_fraction_ = from.fg_fraction_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}